

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O3

void __thiscall
luna::SemanticAnalysisVisitor::Visit
          (SemanticAnalysisVisitor *this,ElseIfStatement *elseif_stmt,void *data)

{
  SyntaxTree *pSVar1;
  Guard g;
  ExpVarData exp_var_data;
  _Any_data local_80;
  code *local_70;
  code *local_68;
  _Any_data local_60;
  code *local_50;
  code *local_48;
  Guard local_40;
  undefined8 local_1c;
  undefined1 local_14;
  
  local_1c = 1;
  local_14 = 0;
  pSVar1 = (elseif_stmt->exp_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this);
  local_60._8_8_ = 0;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp:354:13)>
             ::_M_invoke;
  local_50 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp:354:13)>
             ::_M_manager;
  local_80._8_8_ = 0;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp:354:13)>
             ::_M_invoke;
  local_70 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp:354:13)>
             ::_M_manager;
  local_80._M_unused._M_object = this;
  local_60._M_unused._M_object = this;
  Guard::Guard(&local_40,(function<void_()> *)&local_60,(function<void_()> *)&local_80);
  if (local_70 != (code *)0x0) {
    (*local_70)(&local_80,&local_80,__destroy_functor);
  }
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,__destroy_functor);
  }
  pSVar1 = (elseif_stmt->true_branch_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this,0);
  Guard::~Guard(&local_40);
  pSVar1 = (elseif_stmt->false_branch_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  if (pSVar1 != (SyntaxTree *)0x0) {
    (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this,0);
  }
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(ElseIfStatement *elseif_stmt, void *data)
    {
        ExpVarData exp_var_data{ SemanticOp_Read };
        elseif_stmt->exp_->Accept(this, &exp_var_data);

        {
            SEMANTIC_ANALYSIS_GUARD(EnterBlock, LeaveBlock);
            elseif_stmt->true_branch_->Accept(this, nullptr);
        }

        if (elseif_stmt->false_branch_)
            elseif_stmt->false_branch_->Accept(this, nullptr);
    }